

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::SimpleModifier::SimpleModifier
          (SimpleModifier *this,SimpleFormatter *simpleFormatter,Field field,bool strong,
          Parameters parameters)

{
  int iVar1;
  char16_t cVar2;
  int32_t iVar3;
  char16_t *compiledPattern;
  undefined8 uVar4;
  int32_t argLimit;
  bool strong_local;
  Field field_local;
  SimpleFormatter *simpleFormatter_local;
  SimpleModifier *this_local;
  Parameters parameters_local;
  
  uVar4 = parameters._8_8_;
  Modifier::Modifier(&this->super_Modifier);
  (this->super_Modifier)._vptr_Modifier = (_func_int **)&PTR__SimpleModifier_004ad960;
  UnicodeString::UnicodeString(&this->fCompiledPattern,&simpleFormatter->compiledPattern);
  this->fField = field;
  this->fStrong = strong;
  this->fPrefixLength = 0;
  this->fSuffixOffset = -1;
  this->fSuffixLength = 0;
  (this->fParameters).obj = parameters.obj;
  (this->fParameters).signum = (char)uVar4;
  *(int3 *)&(this->fParameters).field_0x9 = (int3)((ulong)uVar4 >> 8);
  (this->fParameters).plural = (int)((ulong)uVar4 >> 0x20);
  compiledPattern = UnicodeString::getBuffer(&this->fCompiledPattern);
  iVar3 = UnicodeString::length(&this->fCompiledPattern);
  iVar3 = SimpleFormatter::getArgumentLimit(compiledPattern,iVar3);
  if (iVar3 == 0) {
    cVar2 = UnicodeString::charAt(&this->fCompiledPattern,1);
    this->fPrefixLength = (ushort)cVar2 - 0x100;
    this->fSuffixOffset = -1;
    this->fSuffixLength = 0;
  }
  else {
    cVar2 = UnicodeString::charAt(&this->fCompiledPattern,1);
    if (cVar2 == L'\0') {
      this->fPrefixLength = 0;
      this->fSuffixOffset = 2;
    }
    else {
      cVar2 = UnicodeString::charAt(&this->fCompiledPattern,1);
      this->fPrefixLength = (ushort)cVar2 - 0x100;
      this->fSuffixOffset = this->fPrefixLength + 3;
    }
    iVar1 = this->fPrefixLength;
    iVar3 = UnicodeString::length(&this->fCompiledPattern);
    if (iVar1 + 3 < iVar3) {
      cVar2 = UnicodeString::charAt(&this->fCompiledPattern,this->fSuffixOffset);
      this->fSuffixLength = (ushort)cVar2 - 0x100;
    }
    else {
      this->fSuffixLength = 0;
    }
  }
  return;
}

Assistant:

SimpleModifier::SimpleModifier(const SimpleFormatter &simpleFormatter, Field field, bool strong,
                               const Modifier::Parameters parameters)
        : fCompiledPattern(simpleFormatter.compiledPattern), fField(field), fStrong(strong),
          fParameters(parameters) {
    int32_t argLimit = SimpleFormatter::getArgumentLimit(
            fCompiledPattern.getBuffer(), fCompiledPattern.length());
    if (argLimit == 0) {
        // No arguments in compiled pattern
        fPrefixLength = fCompiledPattern.charAt(1) - ARG_NUM_LIMIT;
        U_ASSERT(2 + fPrefixLength == fCompiledPattern.length());
        // Set suffixOffset = -1 to indicate no arguments in compiled pattern.
        fSuffixOffset = -1;
        fSuffixLength = 0;
    } else {
        U_ASSERT(argLimit == 1);
        if (fCompiledPattern.charAt(1) != 0) {
            // Found prefix
            fPrefixLength = fCompiledPattern.charAt(1) - ARG_NUM_LIMIT;
            fSuffixOffset = 3 + fPrefixLength;
        } else {
            // No prefix
            fPrefixLength = 0;
            fSuffixOffset = 2;
        }
        if (3 + fPrefixLength < fCompiledPattern.length()) {
            // Found suffix
            fSuffixLength = fCompiledPattern.charAt(fSuffixOffset) - ARG_NUM_LIMIT;
        } else {
            // No suffix
            fSuffixLength = 0;
        }
    }
}